

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::TraceWriterImpl::~TraceWriterImpl(TraceWriterImpl *this)

{
  _Fwd_list_node_base *p_Var1;
  RootMessage<perfetto::protos::pbzero::TracePacket> *pRVar2;
  _Fwd_list_node_base *p_Var3;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  undefined8 uStack_20;
  
  (this->super_TraceWriter).super_TraceWriterBase._vptr_TraceWriterBase =
       (_func_int **)&PTR__TraceWriterImpl_003a2778;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_003a27c0;
  if (((this->cur_chunk_).begin_ != (uint8_t *)0x0) && ((this->cur_chunk_).size_ != 0)) {
    protozero::Message::Finalize
              ((Message *)
               (this->cur_packet_)._M_t.
               super___uniq_ptr_impl<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_*,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
               .
               super__Head_base<0UL,_protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_*,_false>
               ._M_head_impl);
    local_38 = 0;
    uStack_30 = 0;
    local_28 = (code *)0x0;
    uStack_20 = 0;
    (*(this->super_TraceWriter).super_TraceWriterBase._vptr_TraceWriterBase[3])(this);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,3);
    }
  }
  SharedMemoryArbiterImpl::ReleaseWriterID(this->shmem_arbiter_,this->id_);
  p_Var3 = (this->patch_list_).list_.
           super__Fwd_list_base<perfetto::Patch,_std::allocator<perfetto::Patch>_>._M_impl._M_head.
           _M_next;
  while (p_Var3 != (_Fwd_list_node_base *)0x0) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var1;
  }
  (this->patch_list_).list_.super__Fwd_list_base<perfetto::Patch,_std::allocator<perfetto::Patch>_>.
  _M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
  pRVar2 = (this->cur_packet_)._M_t.
           super___uniq_ptr_impl<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_*,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
           .
           super__Head_base<0UL,_protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_*,_false>
           ._M_head_impl;
  if (pRVar2 != (RootMessage<perfetto::protos::pbzero::TracePacket> *)0x0) {
    protozero::MessageArena::~MessageArena(&pRVar2->root_arena_);
    operator_delete(pRVar2,0x48);
  }
  (this->cur_packet_)._M_t.
  super___uniq_ptr_impl<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_*,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
  .super__Head_base<0UL,_protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_*,_false>.
  _M_head_impl = (RootMessage<perfetto::protos::pbzero::TracePacket> *)0x0;
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&this->protobuf_stream_writer_);
  TraceWriter::~TraceWriter(&this->super_TraceWriter);
  return;
}

Assistant:

TraceWriterImpl::~TraceWriterImpl() {
  if (cur_chunk_.is_valid()) {
    cur_packet_->Finalize();
    Flush();
  }
  // This call may cause the shared memory arbiter (and the underlying memory)
  // to get asynchronously deleted if this was the last trace writer targeting
  // the arbiter and the arbiter was marked for shutdown.
  shmem_arbiter_->ReleaseWriterID(id_);
}